

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O3

vectorTy * CoordVectorBetween(vectorTy *__return_storage_ptr__,positionTy *from,positionTy *to)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [12];
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar9;
  
  auVar11._0_8_ = to->_ts - from->_ts;
  dVar6 = CoordDistance(from->_lat,from->_lon,to->_lat,to->_lon);
  dVar7 = CoordAngle(from->_lat,from->_lon,to->_lat,to->_lon);
  bVar4 = dequal(auVar11._0_8_,0.0);
  dVar1 = to->_alt;
  dVar2 = from->_alt;
  bVar5 = dequal(auVar11._0_8_,0.0);
  __return_storage_ptr__->angle = dVar7;
  __return_storage_ptr__->dist = dVar6;
  auVar10._8_8_ = dVar6;
  auVar10._0_8_ = dVar1 - dVar2;
  auVar11._8_8_ = auVar11._0_8_;
  auVar11 = divpd(auVar10,auVar11);
  uVar9 = (uint)((long)((ulong)bVar4 << 0x3f) >> 0x3f);
  auVar3._4_8_ = 0;
  auVar3._0_4_ = uVar9;
  auVar8._0_12_ = auVar3 << 0x20;
  auVar8._12_4_ = (int)((long)((ulong)bVar5 << 0x3f) >> 0x3f);
  auVar12._4_4_ = uVar9;
  auVar12._0_4_ = uVar9;
  auVar12._8_4_ = auVar8._12_4_;
  auVar12._12_4_ = auVar8._12_4_;
  auVar11 = auVar8 & _DAT_00246840 | ~auVar12 & auVar11;
  __return_storage_ptr__->vsi = (double)auVar11._0_8_;
  __return_storage_ptr__->speed = (double)auVar11._8_8_;
  return __return_storage_ptr__;
}

Assistant:

vectorTy CoordVectorBetween (const positionTy& from, const positionTy& to )
{
    double d_ts = to.ts() - from.ts();
    double dist = CoordDistance (from, to);
    return vectorTy (CoordAngle (from, to),         // angle
                     dist,                          // dist
                     dequal(d_ts,0) ? INFINITY :    // vsi
                        (to.alt_m()-from.alt_m())/d_ts,
                     dequal(d_ts,0) ? INFINITY :    // spped
                        dist/d_ts);
}